

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  LensElementInterface *pLVar4;
  LensElementInterface *pLVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [64];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  Float t;
  Transform LensFromCamera;
  float local_15c;
  Point3fi local_158;
  Ray local_140;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Transform local_b8;
  
  sVar3 = (this->elementInterfaces).nStored;
  fVar28 = 0.0;
  fVar37 = 0.0;
  if (sVar3 != 0) {
    lVar11 = 0;
    do {
      fVar28 = fVar28 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar11);
      lVar11 = lVar11 + 0x10;
      fVar37 = fVar28;
    } while (sVar3 << 4 != lVar11);
  }
  local_108 = ZEXT416((uint)fVar37);
  Scale(&local_b8,1.0,1.0,-1.0);
  fVar28 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._4_4_ = fVar28;
  auVar16._0_4_ = fVar28;
  auVar16._8_4_ = fVar28;
  auVar16._12_4_ = fVar28;
  fVar28 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar20._4_4_ = fVar28;
  auVar20._0_4_ = fVar28;
  auVar20._8_4_ = fVar28;
  auVar20._12_4_ = fVar28;
  fVar28 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar24._4_4_ = fVar28;
  auVar24._0_4_ = fVar28;
  auVar24._8_4_ = fVar28;
  auVar24._12_4_ = fVar28;
  auVar14 = vmovlhps_avx(auVar16,auVar20);
  local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar14._0_8_;
  local_140.o.super_Tuple3<pbrt::Point3,_float>.z = auVar14._8_4_;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar14._12_4_;
  uVar2 = vmovlps_avx(auVar24);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&local_158,&local_b8,(Point3fi *)&local_140);
  auVar14._4_4_ = local_b8.m.m[0][2];
  auVar14._8_4_ = local_b8.m.m[0][3];
  auVar14._0_4_ = local_b8.m.m[0][1];
  auVar14._12_4_ = local_b8.m.m[1][0];
  fVar28 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar35._4_4_ = local_b8.m.m[0][1];
  auVar35._0_4_ = local_b8.m.m[0][0];
  auVar35._8_4_ = local_b8.m.m[0][2];
  auVar35._12_4_ = local_b8.m.m[0][3];
  fVar37 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar29._4_4_ = fVar37;
  auVar29._0_4_ = fVar37;
  auVar29._8_4_ = fVar37;
  auVar29._12_4_ = fVar37;
  auVar6._8_4_ = local_b8.m.m[1][0];
  auVar6._0_4_ = local_b8.m.m[0][2];
  auVar6._4_4_ = local_b8.m.m[0][3];
  auVar6._12_4_ = local_b8.m.m[1][1];
  auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)local_b8.m.m[1][1]),0x10);
  auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)local_b8.m.m[1][0]),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)local_b8.m.m[1][2]),0x10);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * local_b8.m.m[2][1])),auVar29,
                            ZEXT416((uint)local_b8.m.m[2][0]));
  auVar25._0_4_ = fVar28 * auVar14._0_4_;
  auVar25._4_4_ = fVar28 * auVar14._4_4_;
  auVar25._8_4_ = fVar28 * auVar14._8_4_;
  auVar25._12_4_ = fVar28 * auVar14._12_4_;
  auVar14 = vfmadd213ps_fma(auVar35,auVar29,auVar25);
  fVar28 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._4_4_ = fVar28;
  auVar26._0_4_ = fVar28;
  auVar26._8_4_ = fVar28;
  auVar26._12_4_ = fVar28;
  auVar16 = vfmadd231ss_fma(auVar16,auVar26,ZEXT416((uint)local_b8.m.m[2][2]));
  auVar35 = vfmadd213ps_fma(auVar6,auVar26,auVar14);
  auVar14 = vmovshdup_avx(auVar35);
  fVar28 = auVar14._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),auVar35,auVar35);
  auVar6 = vfmadd231ss_fma(auVar6,auVar16,auVar16);
  if (auVar6._0_4_ <= 0.0) {
    auVar17._8_8_ = 0;
    auVar17._0_4_ =
         local_158.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar17._4_4_ =
         local_158.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
  }
  else {
    auVar21._8_4_ = 0x7fffffff;
    auVar21._0_8_ = 0x7fffffff7fffffff;
    auVar21._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx(auVar14,auVar21);
    auVar24 = vandps_avx(auVar35,auVar21);
    auVar25 = vandps_avx(auVar16,auVar21);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar24);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT816(0) << 0x20,auVar25);
    fVar15 = auVar20._0_4_ / auVar6._0_4_;
    fVar37 = auVar35._0_4_ * fVar15;
    local_e8 = ZEXT416((uint)(auVar16._0_4_ * fVar15));
    i.high = fVar37;
    i.low = fVar37;
    local_f8 = ZEXT416((uint)(fVar28 * fVar15));
    local_118 = auVar35;
    local_d8 = auVar16;
    local_c8 = auVar14;
    auVar36._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_158,i);
    auVar36._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar36._0_16_);
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)uVar2;
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_f8._0_4_;
    i_00.low = (float)local_f8._0_4_;
    auVar39._0_8_ =
         Interval<float>::operator+<float>
                   (&local_158.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar39._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar39._0_16_);
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)uVar2;
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_e8._0_4_;
    i_01.low = (float)local_e8._0_4_;
    auVar40._0_8_ =
         Interval<float>::operator+<float>
                   (&local_158.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar40._8_56_ = extraout_var_01;
    auVar17 = auVar40._0_16_;
    auVar35 = local_118;
    auVar14 = local_c8;
    auVar16 = local_d8;
  }
  auVar40 = ZEXT1664(auVar16);
  auVar39 = ZEXT1664(auVar14);
  auVar36 = ZEXT1664(auVar35);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._0_4_;
  auVar9._4_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar9._0_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar9._8_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar9._12_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar14 = vhaddps_avx(auVar17,auVar17);
  local_140.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(rCamera->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar6 = vinsertps_avx(auVar9,ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  auVar22._0_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar22._4_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar22._8_4_ = auVar6._8_4_ + 0.0;
  auVar22._12_4_ = auVar6._12_4_ + 0.0;
  local_140.o.super_Tuple3<pbrt::Point3,_float>.z = auVar14._0_4_ * 0.5;
  auVar7._8_4_ = 0x3f000000;
  auVar7._0_8_ = 0x3f0000003f000000;
  auVar7._12_4_ = 0x3f000000;
  auVar13 = vmulps_avx512vl(auVar22,auVar7);
  local_140.time = rCamera->time;
  local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
  uVar2 = vmovlps_avx(auVar35);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  if ((this->elementInterfaces).nStored != 0) {
    auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar11 = 0;
    uVar12 = 0;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(local_108,auVar8);
    auVar41 = ZEXT1664(auVar14);
    do {
      pLVar4 = (this->elementInterfaces).ptr;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
      fVar28 = *(float *)((long)&pLVar4->curvatureRadius + lVar11);
      if ((fVar28 != 0.0) || (NAN(fVar28))) {
        local_108 = auVar41._0_16_;
        local_118._0_4_ = fVar28;
        bVar10 = IntersectSphericalElement
                           (fVar28,auVar41._0_4_ + fVar28,&local_140,&local_15c,
                            (Normal3f *)&local_158);
        auVar41 = ZEXT1664(local_108);
        auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
        if (!bVar10) {
          return 0.0;
        }
        auVar34._4_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar34._0_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar34._8_8_ = 0;
        auVar36 = ZEXT1664(auVar34);
        auVar23._8_8_ = 0;
        auVar23._0_4_ = local_140.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar23._4_4_ = local_140.o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar14 = vmovshdup_avx(auVar34);
        auVar39 = ZEXT1664(auVar14);
        fVar28 = (float)local_118._0_4_;
      }
      else {
        local_15c = (auVar41._0_4_ - local_140.o.super_Tuple3<pbrt::Point3,_float>.z) /
                    auVar40._0_4_;
        auVar23 = auVar13;
        if (local_15c < 0.0) {
          return 0.0;
        }
      }
      fVar37 = *(float *)((long)&pLVar4->apertureRadius + lVar11);
      auVar35 = auVar36._0_16_;
      auVar13._0_4_ = local_15c * auVar36._0_4_ + auVar23._0_4_;
      auVar13._4_4_ = local_15c * auVar36._4_4_ + auVar23._4_4_;
      auVar13._8_4_ = local_15c * auVar36._8_4_ + auVar23._8_4_;
      auVar13._12_4_ = local_15c * auVar36._12_4_ + auVar23._12_4_;
      auVar27._0_4_ = auVar13._0_4_ * auVar13._0_4_;
      auVar27._4_4_ = auVar13._4_4_ * auVar13._4_4_;
      auVar27._8_4_ = auVar13._8_4_ * auVar13._8_4_;
      auVar27._12_4_ = auVar13._12_4_ * auVar13._12_4_;
      auVar14 = vmovshdup_avx(auVar27);
      auVar14 = vfmadd231ss_fma(auVar14,auVar13,auVar13);
      if (fVar37 * fVar37 < auVar14._0_4_) {
        return 0.0;
      }
      local_140.o.super_Tuple3<pbrt::Point3,_float>.z =
           local_140.d.super_Tuple3<pbrt::Vector3,_float>.z * local_15c +
           local_140.o.super_Tuple3<pbrt::Point3,_float>.z;
      local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
      if ((fVar28 != 0.0) || (NAN(fVar28))) {
        pLVar5 = (this->elementInterfaces).ptr;
        fVar28 = 1.0;
        if (uVar12 != 0) {
          fVar37 = *(float *)((long)pLVar5 + lVar11 + -8);
          if ((fVar37 != 0.0) || (NAN(fVar37))) {
            fVar28 = fVar37;
          }
        }
        uVar1 = *(uint *)((long)&pLVar5->eta + lVar11);
        auVar16 = auVar42._0_16_;
        uVar2 = vcmpss_avx512f(ZEXT416(uVar1),auVar16,4);
        bVar10 = (bool)((byte)uVar2 & 1);
        auVar14 = vinsertps_avx(auVar35,auVar39._0_16_,0x10);
        auVar31._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar14._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar14._12_4_ ^ 0x80000000;
        auVar18._0_4_ = -local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar18._4_4_ = 0x80000000;
        auVar18._8_4_ = 0x80000000;
        auVar18._12_4_ = 0x80000000;
        fVar28 = (float)(bVar10 * uVar1 + (uint)!bVar10 * 0x3f800000) / fVar28;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * auVar39._0_4_)),auVar35,auVar35);
        auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_140.d.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar14 = vsqrtss_avx(auVar14,auVar14);
        fVar37 = auVar14._0_4_;
        auVar30._4_4_ = fVar37;
        auVar30._0_4_ = fVar37;
        auVar30._8_4_ = fVar37;
        auVar30._12_4_ = fVar37;
        auVar19._0_4_ = auVar18._0_4_ / fVar37;
        auVar19._4_12_ = auVar18._4_12_;
        auVar14 = vdivps_avx(auVar31,auVar30);
        auVar32._4_4_ =
             local_158.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        auVar32._0_4_ =
             local_158.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        auVar32._8_8_ = 0;
        auVar35 = vmovshdup_avx(auVar32);
        auVar6 = vmovshdup_avx(auVar14);
        auVar35 = vfmadd213ss_fma(auVar35,auVar6,
                                  ZEXT416((uint)(local_158.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low * auVar19._0_4_)));
        auVar6 = vfmsub231ss_fma(ZEXT416((uint)(local_158.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .low * auVar19._0_4_)),
                                 ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               low),auVar19);
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ + auVar6._0_4_)),auVar32,auVar14);
        auVar35 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
        auVar35 = vmaxss_avx(auVar35,auVar16);
        fVar37 = auVar35._0_4_ / (fVar28 * fVar28);
        if (1.0 <= fVar37) {
          return 0.0;
        }
        auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar37)),auVar16);
        auVar35 = vsqrtss_avx(auVar35,auVar35);
        fVar37 = auVar6._0_4_ / fVar28 - auVar35._0_4_;
        auVar38._4_4_ = fVar28;
        auVar38._0_4_ = fVar28;
        auVar38._8_4_ = fVar28;
        auVar38._12_4_ = fVar28;
        auVar14 = vdivps_avx(auVar14,auVar38);
        auVar33._0_4_ =
             local_158.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low * fVar37;
        auVar33._4_4_ =
             local_158.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high * fVar37;
        auVar33._8_4_ = fVar37 * 0.0;
        auVar33._12_4_ = fVar37 * 0.0;
        local_140.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_158.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low * fVar37 -
             auVar19._0_4_ / fVar28;
        auVar35 = vsubps_avx(auVar33,auVar14);
        auVar36 = ZEXT1664(auVar35);
        auVar14 = vmovshdup_avx(auVar35);
        auVar39 = ZEXT1664(auVar14);
        uVar2 = vmovlps_avx(auVar35);
        local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
        local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
      }
      auVar35 = auVar36._0_16_;
      auVar40 = ZEXT464((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar41 = ZEXT464((uint)(auVar41._0_4_ + *(float *)((long)&pLVar4->thickness + lVar11)));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < (this->elementInterfaces).nStored);
  }
  if (rOut != (Ray *)0x0) {
    uVar2 = vmovlps_avx(auVar13);
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.z = -local_140.o.super_Tuple3<pbrt::Point3,_float>.z
    ;
    uVar2 = vmovlps_avx(auVar35);
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
    rOut->time = local_140.time;
    (rOut->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return 1.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}